

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_csv.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::CSVReaderDeserialize(Deserializer *deserializer,TableFunction *function)

{
  NotImplementedException *this;
  string local_40;
  
  this = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"CSVReaderDeserialize not implemented","");
  NotImplementedException::NotImplementedException(this,&local_40);
  __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static unique_ptr<FunctionData> CSVReaderDeserialize(Deserializer &deserializer, TableFunction &function) {
	throw NotImplementedException("CSVReaderDeserialize not implemented");
	// auto &context = deserializer.Get<ClientContext &>();
	// SerializedReadCSVData serialized_data;
	// deserializer.ReadProperty(100, "extra_info", function.extra_info);
	// deserializer.ReadProperty(101, "csv_data", serialized_data);
	//
	// vector<Value> file_path;
	// for (auto &path : serialized_data.files) {
	// 	file_path.emplace_back(path);
	// }
	// auto multi_file_reader = MultiFileReader::Create(function);
	// auto file_list = multi_file_reader->CreateFileList(context, Value::LIST(LogicalType::VARCHAR, file_path),
	//                                                    FileGlobOptions::ALLOW_EMPTY);
	// auto csv_options = make_uniq<CSVFileReaderOptions>();
	// csv_options->options = std::move(serialized_data.options.options);
	//
	// auto bind_data = MultiFileFunction<CSVMultiFileInfo>::MultiFileBindInternal(
	//     context, std::move(multi_file_reader), std::move(file_list), serialized_data.return_types,
	//     serialized_data.return_names, std::move(serialized_data.options.file_options), std::move(csv_options));
	// return bind_data;
}